

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          JPPV_sharedPtr *jpolJPPV,Index ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  value_type_conflict1 *__value;
  pointer ppJVar2;
  pointer psVar3;
  sp_counted_base *psVar4;
  code *pcVar5;
  element_type *peVar6;
  _func_int *p_Var7;
  JointPolicyDiscretePure *pJVar8;
  JointPolicyPureVectorForClusteredBG *this_00;
  undefined8 uVar9;
  pointer puVar10;
  pointer puVar11;
  PlanningUnitDecPOMDPDiscrete *pPVar12;
  int iVar13;
  Index IVar14;
  uint uVar15;
  undefined4 extraout_var;
  pointer puVar16;
  long lVar17;
  _Base_ptr p_Var18;
  undefined8 *puVar19;
  undefined4 in_register_0000000c;
  Index IVar20;
  Index *oIs;
  ulong uVar21;
  Index *aIs;
  _Self __tmp;
  Index IVar22;
  ulong uVar23;
  Index aIStack_150 [8];
  uint auStack_130 [2];
  Index aIStack_128 [2];
  undefined1 *puStack_120;
  Index aIStack_118 [2];
  _Rb_tree_node_base *local_110;
  ulong local_108;
  JointPolicyDiscretePure *local_100;
  ulong local_f8;
  TypeCluster *local_f0;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  *local_e8;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *local_e0;
  JointPolicyPureVectorForClusteredBG *local_d8;
  ulong local_d0;
  JPPV_sharedPtr local_c8;
  undefined1 local_b8 [16];
  pointer local_a8;
  element_type *local_98;
  shared_count sStack_90;
  JPPV_sharedPtr *local_88;
  ulong local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined8 local_58;
  Index local_4c;
  PlanningUnitDecPOMDPDiscrete *local_48;
  allocator_type local_39;
  ulong local_38;
  
  local_58 = CONCAT44(in_register_0000000c,ts);
  uVar21 = (ulong)ts;
  ppJVar2 = (jpolBGVec->
            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_e0 = jpolBGVec;
  local_d8 = this;
  local_88 = jpolJPPV;
  local_48 = pu;
  if (((ulong)((long)(jpolBGVec->
                     super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar2 >> 3) <= uVar21) ||
     (psVar3 = (bgVec->
               super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (ulong)((long)(bgVec->
                   super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar21)) {
    puStack_120 = &LAB_00381b65;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  local_100 = ppJVar2[uVar21];
  psVar4 = psVar3[uVar21].pn.pi_;
  local_98 = psVar3[uVar21].px;
  sStack_90.pi_ = psVar3[uVar21].pn.pi_;
  if (psVar4 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar4->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  local_f8 = (ulong)(ts - 1);
  local_80 = (ulong)(ts + 1);
  local_38 = 0;
  local_108 = uVar21 * 4 + 0xf & 0xfffffffffffffff0;
  local_e8 = bgVec;
  while( true ) {
    puStack_120 = (undefined1 *)0x38182a;
    iVar13 = (*(local_48->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])
                       ();
    uVar21 = local_38 & 0xffffffff;
    if (CONCAT44(extraout_var,iVar13) <= uVar21) {
      puStack_120 = (undefined1 *)0x381ae7;
      boost::detail::shared_count::~shared_count(&sStack_90);
      return;
    }
    puVar16 = (local_98->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_98->super_BayesianGameForDecPOMDPStage).
                      super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface.
                      super_BayesianGameBase._m_nrTypes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar16 >> 3) <= uVar21) break;
    uVar23 = 0;
    local_d0 = uVar21;
    while( true ) {
      IVar22 = (Index)uVar23;
      if (puVar16[local_d0] <= uVar23) break;
      puStack_120 = (undefined1 *)0x38187f;
      local_f0 = BayesianGameWithClusterInfo::GetTypeCluster(local_98,(Index)local_38,IVar22);
      p_Var18 = (local_f0->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_110 = &(local_f0->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_4c = IVar22;
      if (p_Var18 != local_110) {
        do {
          if (*(int *)(*(long *)(p_Var18 + 1) + 8) != 1) {
            puStack_120 = (undefined1 *)0x381b00;
            puVar19 = (undefined8 *)__cxa_allocate_exception(0x28);
            *puVar19 = &PTR__E_0059bd80;
            puVar19[1] = puVar19 + 3;
            puStack_120 = (undefined1 *)0x381b30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar19 + 1),
                       "JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent - expected an AOHINDEX type"
                       ,"");
            puStack_120 = (undefined1 *)0x381b46;
            __cxa_throw(puVar19,&E::typeinfo,E::~E);
          }
          puStack_120 = (undefined1 *)0x3818c5;
          lVar17 = __dynamic_cast(*(long *)(p_Var18 + 1),&Type::typeinfo,&Type_AOHIndex::typeinfo,0)
          ;
          uVar21 = local_38;
          pPVar12 = local_48;
          IVar22 = *(Index *)(lVar17 + 0xc);
          aIs = (Index *)((long)aIStack_118 - local_108);
          oIs = (Index *)((long)aIs - local_108);
          IVar20 = (Index)local_58;
          oIs[-2] = 0x3818ff;
          oIs[-1] = 0;
          PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                    (&pPVar12->super_PlanningUnitMADPDiscrete,(Index)uVar21,IVar22,IVar20,aIs,oIs);
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (IVar20 != 0) {
            __value = oIs + local_f8;
            oIs[-2] = 0x381932;
            oIs[-1] = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,(ulong)*oIs,
                       __value,&local_39);
            puVar11 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar10 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_a8;
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
            local_b8 = ZEXT816(0) << 0x20;
            local_a8 = (pointer)0x0;
            if (puVar10 != (pointer)0x0) {
              oIs[-2] = 0x381976;
              oIs[-1] = 0;
              operator_delete(puVar10,(long)puVar11 - (long)puVar10);
            }
            uVar9 = local_b8._0_8_;
            if ((pointer)local_b8._0_8_ != (pointer)0x0) {
              uVar21 = (long)local_a8 - local_b8._0_8_;
              oIs[-2] = 0x381991;
              oIs[-1] = 0;
              operator_delete((void *)uVar9,uVar21);
            }
          }
          uVar21 = local_38;
          pPVar12 = local_48;
          uVar9 = local_58;
          IVar20 = (Index)local_38;
          oIs[-2] = 0x3819a8;
          oIs[-1] = 0;
          IVar14 = PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                             (&pPVar12->super_PlanningUnitMADPDiscrete,IVar20,(Index)uVar9,&local_78
                             );
          IVar20 = local_4c;
          pJVar8 = local_100;
          pcVar5 = *(code **)((long)(local_100->super_JointPolicyDiscrete).super_JointPolicy.
                                    _vptr_JointPolicy + 0x98);
          oIs[-2] = 0x3819c0;
          oIs[-1] = 0;
          uVar15 = (*pcVar5)(pJVar8,uVar21 & 0xffffffff,IVar20);
          peVar6 = local_88->px;
          p_Var7 = (peVar6->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                   super_JointPolicy._vptr_JointPolicy[0x10];
          oIs[-2] = 0x3819da;
          oIs[-1] = 0;
          (*p_Var7)(peVar6,uVar21,(ulong)IVar14,(ulong)uVar15);
          if (local_80 < (local_48->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon) {
            psVar4 = (local_88->pn).pi_;
            local_c8.px = local_88->px;
            local_c8.pn.pi_ = (local_88->pn).pi_;
            if (psVar4 != (sp_counted_base *)0x0) {
              LOCK();
              piVar1 = &psVar4->use_count_;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
              **)(oIs + -2) = local_e8;
            *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
              **)(oIs + -4) = local_e0;
            oIs[-6] = uVar15;
            *(TypeCluster **)(oIs + -10) = local_f0;
            oIs[-0xc] = IVar14;
            uVar23 = local_38;
            pPVar12 = local_48;
            uVar21 = local_80;
            this_00 = local_d8;
            oIs[-0xe] = 0x381a57;
            oIs[-0xd] = 0;
            RecursivelyFillPolicyForAgent
                      (this_00,pPVar12,&local_c8,(Index)uVar23,(Index)uVar21,IVar22,oIs[-0xc],
                       *(TypeCluster **)(oIs + -10),oIs[-8],oIs[-6],
                       *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                         **)(oIs + -4),
                       *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                         **)(oIs + -2));
            oIs[-2] = 0x381a67;
            oIs[-1] = 0;
            boost::detail::shared_count::~shared_count(&local_c8.pn);
          }
          oIs[-2] = 0x381a6f;
          oIs[-1] = 0;
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
          puVar10 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            uVar21 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            oIs[-2] = 0x381a87;
            oIs[-1] = 0;
            operator_delete(puVar10,uVar21);
          }
        } while (p_Var18 != local_110);
      }
      uVar23 = (ulong)(local_4c + 1);
      puVar16 = (local_98->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar21 = local_d0;
      if ((ulong)((long)(local_98->super_BayesianGameForDecPOMDPStage).
                        super_BayesianGameIdenticalPayoff.super_BayesianGameIdenticalPayoffInterface
                        .super_BayesianGameBase._m_nrTypes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar16 >> 3) <= local_d0)
      goto LAB_00381b46;
    }
    local_38 = (ulong)((Index)local_38 + 1);
  }
LAB_00381b46:
  puStack_120 = (undefined1 *)0x381b57;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar21);
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu,
        JPPV_sharedPtr jpolJPPV,
        Index ts,
        const vector<const JointPolicyDiscretePure*> & jpolBGVec,
        const vector<boost::shared_ptr<const BayesianGameWithClusterInfo> >& bgVec
        ) const 
{
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
#if DEBUG_TOJPPV
    cout << ">>>StartRecursiveConstructionPerAgent jpolBG is "
         << jpolBG->SoftPrint() << endl;
#endif
    BGwCI_constPtr bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                    throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent - expected an AOHINDEX type");
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                jpolJPPV->SetAction(agI, ohI, aI);
                
                if(ts+1 < pu->GetHorizon())
                    RecursivelyFillPolicyForAgent(
                        pu, jpolJPPV, agI, ts+1, aohI, ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}